

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFilters.cpp
# Opt level: O3

void __thiscall
chrono::utils::ChMovingAverage::ChMovingAverage(ChMovingAverage *this,valarray<double> *data,int n)

{
  double *pdVar1;
  double dVar2;
  uint uVar3;
  double *__s;
  double *pdVar4;
  size_t sVar5;
  double *pdVar6;
  uint uVar7;
  double *pdVar8;
  uint uVar9;
  double *pdVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  double dVar16;
  
  (this->m_out)._M_size = 0;
  (this->m_out)._M_data = (double *)0x0;
  lVar13 = data->_M_size << 0x20;
  uVar15 = (uint)data->_M_size;
  sVar5 = (size_t)(int)uVar15;
  if (lVar13 == 0) {
    __s = (double *)0x0;
  }
  else {
    operator_delete((void *)0x0);
    uVar14 = lVar13 >> 0x1d;
    (this->m_out)._M_size = sVar5;
    __s = (double *)::operator_new(uVar14);
    (this->m_out)._M_data = __s;
    memset(__s,0,uVar14);
  }
  uVar3 = uVar15;
  if (n < (int)uVar15) {
    uVar3 = n;
  }
  if (0 < (int)uVar3) {
    uVar14 = 0;
    pdVar4 = data->_M_data;
    pdVar8 = pdVar4 + -1;
    pdVar6 = pdVar4;
    do {
      pdVar6 = pdVar6 + 1;
      dVar16 = pdVar4[uVar14];
      __s[uVar14] = dVar16;
      if (uVar14 != 0) {
        uVar12 = 0;
        pdVar10 = pdVar8;
        do {
          dVar2 = *pdVar10;
          pdVar10 = pdVar10 + -1;
          pdVar1 = pdVar6 + uVar12;
          uVar12 = uVar12 + 1;
          dVar16 = dVar16 + dVar2 + *pdVar1;
          __s[uVar14] = dVar16;
        } while (uVar14 != uVar12);
      }
      pdVar8 = pdVar8 + 1;
      __s[uVar14] = dVar16 / (double)((int)uVar14 * 2 + 1);
      uVar14 = uVar14 + 1;
    } while (uVar14 != uVar3);
    if (0 < (int)uVar3) {
      uVar14 = 0;
      pdVar8 = data->_M_data;
      uVar7 = uVar15;
      do {
        uVar7 = uVar7 - 1;
        uVar9 = (uint)uVar14;
        iVar11 = ~uVar9 + uVar15;
        dVar16 = pdVar8[iVar11];
        __s[iVar11] = dVar16;
        if (uVar14 != 0) {
          uVar12 = 0;
          pdVar4 = pdVar8 + (long)(int)uVar7 + -1;
          do {
            dVar2 = *pdVar4;
            pdVar4 = pdVar4 + -1;
            lVar13 = uVar12 + 1;
            uVar12 = uVar12 + 1;
            dVar16 = dVar16 + dVar2 + pdVar8[(int)uVar7 + lVar13];
            __s[iVar11] = dVar16;
          } while (uVar14 != uVar12);
        }
        uVar14 = uVar14 + 1;
        __s[iVar11] = dVar16 / (double)(int)(uVar9 * 2 + 1);
      } while (uVar14 != uVar3);
    }
  }
  if ((int)uVar3 < (int)(uVar15 - uVar3)) {
    if ((long)n < (long)sVar5) {
      sVar5 = (long)n;
    }
    iVar11 = (int)sVar5;
    pdVar6 = data->_M_data;
    pdVar4 = pdVar6 + sVar5 + 1;
    pdVar8 = pdVar6 + sVar5;
    do {
      dVar16 = pdVar6[sVar5];
      __s[sVar5] = dVar16;
      if (0 < n) {
        lVar13 = -1;
        pdVar10 = pdVar4;
        do {
          pdVar1 = pdVar8 + lVar13;
          lVar13 = lVar13 + -1;
          dVar2 = *pdVar10;
          pdVar10 = pdVar10 + 1;
          dVar16 = dVar16 + *pdVar1 + dVar2;
          __s[sVar5] = dVar16;
        } while (-lVar13 != (ulong)(n + 1));
      }
      pdVar4 = pdVar4 + 1;
      pdVar8 = pdVar8 + 1;
      __s[sVar5] = dVar16 / (double)(n * 2 + 1);
      sVar5 = sVar5 + 1;
    } while (uVar15 + iVar11 + uVar3 * -2 != (int)sVar5);
  }
  return;
}

Assistant:

ChMovingAverage::ChMovingAverage(const std::valarray<double>& data, int n) {
    int np = (int)data.size();
    m_out.resize(np);

    // Start and end of data
    int lim = ChMin(n, np);
    for (int i = 0; i < lim; i++) {
        m_out[i] = data[i];
        for (int j = 1; j <= i; j++)
            m_out[i] += data[i - j] + data[i + j];
        m_out[i] /= (2 * i + 1);
    }

    for (int i = 0; i < lim; i++) {
        m_out[np - 1 - i] = data[np - 1 - i];
        for (int j = 1; j <= i; j++)
            m_out[np - 1 - i] += data[np - 1 - i - j] + data[np - 1 - i + j];
        m_out[np - 1 - i] /= (2 * i + 1);
    }

    // Middle values
    for (int i = lim; i < np - lim; i++) {
        m_out[i] = data[i];
        for (int j = 1; j <= n; j++)
            m_out[i] += data[i - j] + data[i + j];
        m_out[i] /= (2 * n + 1);
    }
}